

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_HashTable.h
# Opt level: O3

Iterator __thiscall
axl::sl::
HashTable<char,_axl::sl::SwitchInfo_*,_axl::sl::HashId<char>,_axl::sl::Eq<char,_char>,_char,_axl::sl::SwitchInfo_*>
::visit(HashTable<char,_axl::sl::SwitchInfo_*,_axl::sl::HashId<char>,_axl::sl::Eq<char,_char>,_char,_axl::sl::SwitchInfo_*>
        *this,char key)

{
  Array<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
  *this_00;
  size_t *psVar1;
  IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
  IVar2;
  IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
  IVar3;
  HashTableEntry<char,_axl::sl::SwitchInfo_*> *pHVar4;
  bool bVar5;
  IteratorImpl<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
  IVar6;
  HashTable<char,_axl::sl::SwitchInfo_*,_axl::sl::HashId<char>,_axl::sl::Eq<char,_char>,_char,_axl::sl::SwitchInfo_*>
  *pHVar7;
  AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
  *pAVar8;
  HashTableEntry<char,_axl::sl::SwitchInfo_*> *pHVar9;
  size_t sVar10;
  ListLink *link;
  
  this_00 = &this->m_table;
  sVar10 = (this->m_table).
           super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
           .m_count;
  if (sVar10 == 0) {
    sVar10 = 0x20;
    bVar5 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>,axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>,axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>::GetBucketLink>>>
            ::
            setCountImpl<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>,axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>::GetBucketLink>>::Construct>
                      ((Array<axl::sl::AuxList<axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>,axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>,axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>::GetBucketLink>>>
                        *)this_00,0x20);
    if (!bVar5) {
      return (Iterator)(Entry *)0x0;
    }
  }
  bVar5 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
          ::ensureExclusive(this_00);
  pAVar8 = (AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
            *)0x0;
  if (bVar5) {
    pAVar8 = (this_00->
             super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
             ).m_p;
  }
  IVar2.m_p = pAVar8[(ulong)(long)key % sVar10].
              super_ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>
              .super_ListData<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>.m_head;
  IVar3.m_p = IVar2.m_p;
  while( true ) {
    if (IVar3.m_p == (Entry *)0x0) {
      pAVar8 = pAVar8 + (ulong)(long)key % sVar10;
      IVar6.
      super_IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
      .m_p = (IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
              )operator_new(0x38);
      *(undefined8 *)
       ((long)IVar6.
              super_IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
              .m_p + 0x11) = 0;
      *(undefined8 *)
       ((long)IVar6.
              super_IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
              .m_p + 0x18) = 0;
      *(char *)((long)IVar6.
                      super_IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
                      .m_p + 0x10) = key;
      *(AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
        **)((long)IVar6.
                  super_IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
                  .m_p + 0x30) = pAVar8;
      pHVar7 = (HashTable<char,_axl::sl::SwitchInfo_*,_axl::sl::HashId<char>,_axl::sl::Eq<char,_char>,_char,_axl::sl::SwitchInfo_*>
                *)(this->m_list).
                  super_OwningListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>_>
                  .
                  super_ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>_>
                  .super_ListData<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>.m_tail;
      *(undefined8 *)
       IVar6.
       super_IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
       .m_p = 0;
      *(HashTable<char,_axl::sl::SwitchInfo_*,_axl::sl::HashId<char>,_axl::sl::Eq<char,_char>,_char,_axl::sl::SwitchInfo_*>
        **)((long)IVar6.
                  super_IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
                  .m_p + 8) = pHVar7;
      if (pHVar7 == (HashTable<char,_axl::sl::SwitchInfo_*,_axl::sl::HashId<char>,_axl::sl::Eq<char,_char>,_char,_axl::sl::SwitchInfo_*>
                     *)0x0) {
        pHVar7 = this;
      }
      (pHVar7->m_list).
      super_OwningListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>_>
      .
      super_ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>_>
      .super_ListData<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>.m_head =
           (HashTableEntry<char,_axl::sl::SwitchInfo_*> *)
           IVar6.
           super_IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
           .m_p;
      (this->m_list).
      super_OwningListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>_>
      .
      super_ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>_>
      .super_ListData<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>.m_tail =
           (HashTableEntry<char,_axl::sl::SwitchInfo_*> *)
           IVar6.
           super_IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
           .m_p;
      psVar1 = &(this->m_list).
                super_OwningListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>_>
                .
                super_ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>_>
                .super_ListData<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>.m_count;
      *psVar1 = *psVar1 + 1;
      pHVar4 = (pAVar8->
               super_ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>
               ).super_ListData<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>.m_tail;
      pHVar9 = pHVar4;
      if (pHVar4 != (HashTableEntry<char,_axl::sl::SwitchInfo_*> *)0x0) {
        pHVar9 = (HashTableEntry<char,_axl::sl::SwitchInfo_*> *)&pHVar4->m_bucketLink;
      }
      *(undefined8 *)
       ((long)IVar6.
              super_IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
              .m_p + 0x20) = 0;
      *(HashTableEntry<char,_axl::sl::SwitchInfo_*> **)
       ((long)IVar6.
              super_IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
              .m_p + 0x28) = pHVar9;
      if (pHVar4 == (HashTableEntry<char,_axl::sl::SwitchInfo_*> *)0x0) {
        (pAVar8->
        super_ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>
        ).super_ListData<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>.m_head =
             (HashTableEntry<char,_axl::sl::SwitchInfo_*> *)
             IVar6.
             super_IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
             .m_p;
      }
      else {
        (pHVar4->m_bucketLink).m_next =
             (ListLink *)
             ((long)IVar6.
                    super_IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
                    .m_p + 0x20);
      }
      (pAVar8->
      super_ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>
      ).super_ListData<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>.m_tail =
           (HashTableEntry<char,_axl::sl::SwitchInfo_*> *)
           IVar6.
           super_IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
           .m_p;
      psVar1 = &(pAVar8->
                super_ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>
                ).super_ListData<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>.m_count;
      *psVar1 = *psVar1 + 1;
      if (this->m_resizeThreshold <
          ((this->m_list).
           super_OwningListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>_>
           .
           super_ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>_>
           .super_ListData<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>.m_count * 100) /
          sVar10) {
        setBucketCount(this,sVar10 * 2);
      }
      return (Iterator)
             (Entry *)IVar6.
                      super_IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
                      .m_p;
    }
    if (*(char *)((long)IVar2.m_p + 0x10) == key) break;
    IVar3.m_p = *(Entry **)((long)IVar2.m_p + 0x20);
    IVar2.m_p = (Entry *)&IVar3.m_p[-1].super_MapEntry<char,_axl::sl::SwitchInfo_*>.m_value;
  }
  return (Iterator)IVar2.m_p;
}

Assistant:

Iterator
	visit(KeyArg key) {
		size_t bucketCount = m_table.getCount();
		if (!bucketCount) {
			bucketCount = Def_InitialBucketCount;

			bool result = m_table.setCount(bucketCount);
			if (!result)
				return NULL;
		}

		size_t hash = m_hash(key);
		Bucket* bucket = &m_table.rwi()[hash % bucketCount];
		typename Bucket::Iterator it = bucket->getHead();
		for (; it; it++) {
			bool isEqual = m_eq(key, it->m_key);
			if (isEqual)
				return it;
		}

		Entry* entry = new (mem::ZeroInit) Entry;
		entry->m_key = key;
		entry->m_bucket = bucket;
		m_list.insertTail(entry);
		bucket->insertTail(entry);

	#if (AXL_PTR_BITS == 64)
		size_t loadFactor = getCount() * 100 / bucketCount;
	#else
		size_t loadFactor = (size_t)((uint64_t)getCount() * 100 / bucketCount);
	#endif

		if (loadFactor > m_resizeThreshold)
			setBucketCount(bucketCount * 2);

		return entry;
	}